

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

void __thiscall TcpSocketImpl::Close(TcpSocketImpl *this)

{
  byte bVar1;
  __int_type_conflict _Var2;
  bool bVar3;
  bool local_42;
  int local_34;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  type local_28;
  thread local_20;
  byte local_11;
  TcpSocketImpl *pTStack_10;
  bool bIsLocked;
  TcpSocketImpl *this_local;
  
  this->m_bCloseReq = true;
  pTStack_10 = this;
  do {
    local_11 = std::mutex::try_lock(&(this->super_BaseSocketImpl).m_mxWrite);
    std::condition_variable::notify_all();
    if ((local_11 & 1) == 1) {
      std::mutex::unlock(&(this->super_BaseSocketImpl).m_mxWrite);
    }
    bVar1 = std::__atomic_base::operator_cast_to_unsigned_char
                      ((__atomic_base *)&(this->super_BaseSocketImpl).m_iShutDownState);
    bVar3 = false;
    if ((bVar1 & 2) == 0) {
      bVar3 = (this->super_BaseSocketImpl).m_iError == 0;
    }
  } while (bVar3);
  (this->super_BaseSocketImpl).m_bStop = true;
  if ((((this->m_pRefServSocket == (TcpServer *)0x0) &&
       (_Var2 = std::__atomic_base::operator_cast_to_unsigned_char
                          ((__atomic_base *)&(this->super_BaseSocketImpl).m_iShutDownState),
       _Var2 == '\x0f')) &&
      ((bVar3 = std::function::operator_cast_to_bool
                          ((function *)&(this->super_BaseSocketImpl).m_fClosing), bVar3 ||
       (bVar3 = std::function::operator_cast_to_bool
                          ((function *)&(this->super_BaseSocketImpl).m_fClosingParam), bVar3)))) &&
     (bVar3 = std::thread::joinable(&(this->super_BaseSocketImpl).m_thClose), !bVar3)) {
    local_28.this = this;
    std::thread::thread<TcpSocketImpl::Close()::__0,,void>(&local_20,&local_28);
    std::thread::operator=(&(this->super_BaseSocketImpl).m_thClose,&local_20);
    std::thread::~thread(&local_20);
    while( true ) {
      bVar3 = std::operator!=(&(this->super_BaseSocketImpl).m_fClosingParam,(nullptr_t)0x0);
      local_42 = true;
      if (!bVar3) {
        local_42 = std::operator!=(&(this->super_BaseSocketImpl).m_fClosing,(nullptr_t)0x0);
      }
      if (local_42 == false) break;
      local_34 = 1;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_30,&local_34);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_30);
    }
  }
  return;
}

Assistant:

void TcpSocketImpl::Close()
{
    //OutputDebugString(L"TcpSocketImpl::Close\r\n");
    m_bCloseReq = true; // Stops the write thread after the last byte was send
    do
    {
        const bool bIsLocked = m_mxWrite.try_lock();
        m_cv.notify_all();
        if (bIsLocked == true)
            m_mxWrite.unlock();
    } while ((m_iShutDownState & 2) == 0 && m_iError == 0); // Wait until the write thread is finished
    m_bStop = true; // Stops the listening thread

    if (m_pRefServSocket == nullptr && m_iShutDownState == 15 && (m_fClosing || m_fClosingParam) && m_thClose.joinable() == false)
    {
        m_thClose = thread([&]() {
            StartClosingCB();
        });

        while (m_fClosingParam != nullptr || m_fClosing != nullptr)
            this_thread::sleep_for(chrono::milliseconds(1));
    }
}